

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNpn2.c
# Opt level: O0

void Dtt_PrintMulti1(Dtt_Man_t *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *vUsed;
  Vec_Int_t *vTimes;
  int local_20;
  int Prev;
  int Count;
  int Entry;
  int n;
  int i;
  Dtt_Man_t *p_local;
  
  Count = 0;
  while( true ) {
    if (0xf < Count) {
      return;
    }
    p_00 = Vec_IntAlloc(100);
    p_01 = Vec_IntAlloc(100);
    for (Entry = 0; Entry < p->nClasses; Entry = Entry + 1) {
      if (p->pNodes[Entry] == Count) {
        Vec_IntPush(p_00,p->pTimes[Entry]);
      }
    }
    iVar1 = Vec_IntSize(p_00);
    if (iVar1 == 0) break;
    Vec_IntSort(p_00,0);
    local_20 = 1;
    vTimes._4_4_ = Vec_IntEntry(p_00,0);
    for (Entry = 1; iVar1 = Vec_IntSize(p_00), Entry < iVar1; Entry = Entry + 1) {
      iVar1 = Vec_IntEntry(p_00,Entry);
      if (vTimes._4_4_ == iVar1) {
        local_20 = local_20 + 1;
      }
      else {
        if (iVar1 <= vTimes._4_4_) {
          __assert_fail("Prev < Entry",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauNpn2.c"
                        ,0x27f,"void Dtt_PrintMulti1(Dtt_Man_t *)");
        }
        Vec_IntPushTwo(p_01,vTimes._4_4_,local_20);
        local_20 = 1;
        vTimes._4_4_ = iVar1;
      }
    }
    if (0 < local_20) {
      Vec_IntPushTwo(p_01,vTimes._4_4_,local_20);
    }
    printf("n=%d : ");
    for (Entry = 0; iVar1 = Vec_IntSize(p_01), Entry + 1 < iVar1; Entry = Entry + 2) {
      uVar2 = Vec_IntEntry(p_01,Entry);
      uVar3 = Vec_IntEntry(p_01,Entry + 1);
      printf("%d=%d ",(ulong)uVar2,(ulong)uVar3);
    }
    printf("\n");
    Vec_IntFree(p_00);
    Vec_IntFree(p_01);
    Count = Count + 1;
  }
  Vec_IntFree(p_00);
  Vec_IntFree(p_01);
  return;
}

Assistant:

void Dtt_PrintMulti1( Dtt_Man_t * p )
{
    int i, n, Entry, Count, Prev;
    for ( n = 0; n < 16; n++ )
    {
        Vec_Int_t * vTimes = Vec_IntAlloc( 100 );
        Vec_Int_t * vUsed  = Vec_IntAlloc( 100 );
        for ( i = 0; i < p->nClasses; i++ )
            if ( p->pNodes[i] == n )
                Vec_IntPush( vTimes, p->pTimes[i] );
        if ( Vec_IntSize(vTimes) == 0 )
        {
            Vec_IntFree(vTimes);
            Vec_IntFree(vUsed);
            break;
        }
        Vec_IntSort( vTimes, 0 );
        Count = 1;
        Prev = Vec_IntEntry( vTimes, 0 );
        Vec_IntForEachEntryStart( vTimes, Entry, i, 1 )
            if ( Prev == Entry )
                Count++;
            else
            {
                assert( Prev < Entry );
                Vec_IntPushTwo( vUsed, Prev, Count );
                Count = 1;
                Prev = Entry;
            }
        if ( Count > 0 )
            Vec_IntPushTwo( vUsed, Prev, Count );
        printf( "n=%d : ", n);
        Vec_IntForEachEntryDouble( vUsed, Prev, Entry, i )
            printf( "%d=%d ", Prev, Entry );
        printf( "\n" );
        Vec_IntFree( vTimes );
        Vec_IntFree( vUsed );
    }
}